

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConfigLiblistSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConfigLiblistSyntax,slang::syntax::ConfigLiblistSyntax_const&>
          (BumpAllocator *this,ConfigLiblistSyntax *args)

{
  ConfigLiblistSyntax *pCVar1;
  ConfigLiblistSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pCVar1 = (ConfigLiblistSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::ConfigLiblistSyntax::ConfigLiblistSyntax(in_RSI,pCVar1);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }